

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O1

bool __thiscall clickhouse::TypeParser::Parse(TypeParser *this,TypeAst *type)

{
  TypeAst **__args;
  iterator *piVar1;
  _Map_pointer pppTVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t __n;
  char *__s1;
  int iVar6;
  Code CVar7;
  _Elt_pointer extraout_RAX;
  int *piVar8;
  long lVar9;
  _Elt_pointer ppTVar10;
  const_iterator cVar11;
  undefined8 uVar12;
  Meta MVar13;
  size_type __rlen;
  deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>> *this_00;
  uint local_cc;
  TypeAst local_c8;
  Token local_58;
  deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>> *local_40;
  size_type **local_38;
  
  __args = &this->type_;
  this->type_ = type;
  this_00 = (deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>> *)
            &this->open_elements_;
  ppTVar10 = (this->open_elements_).c.
             super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppTVar10 ==
      (this->open_elements_).c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>>::
    _M_push_back_aux<clickhouse::TypeAst*const&>(this_00,__args);
    ppTVar10 = extraout_RAX;
  }
  else {
    *ppTVar10 = type;
    piVar1 = &(this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_cc = (uint)ppTVar10;
  local_40 = this_00;
  do {
    paVar5 = &local_c8.value_string.field_2;
    paVar4 = &local_c8.name.field_2;
    NextToken(&local_58,this);
    __s1 = local_58.value._M_str;
    __n = local_58.value._M_len;
    switch(local_58.type) {
    case Invalid:
      local_cc = 0;
      goto LAB_001476d9;
    case Assign:
    case Comma:
      ppTVar10 = (this->open_elements_).c.
                 super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppTVar10 ==
          (this->open_elements_).c.
          super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppTVar10 = (this->open_elements_).c.
                   super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      *__args = ppTVar10[-1];
      std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::pop_back
                ((deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_> *)this_00);
      local_c8._0_8_ = (size_type **)0x0;
      local_c8.name.field_2._8_8_ = 0;
      local_c8.value_string.field_2._8_8_ = 0;
      local_c8.name._M_string_length = 0;
      local_c8.name.field_2._M_allocated_capacity = 0;
      local_c8.value = 0;
      local_c8.value_string._M_string_length = 0;
      local_c8.value_string.field_2._M_allocated_capacity = 0;
      local_c8.elements.
      super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8.elements.
      super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.elements.
      super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.name._M_dataplus._M_p = (pointer)paVar4;
      local_c8.value_string._M_dataplus._M_p = (pointer)paVar5;
      std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
      emplace_back<clickhouse::TypeAst>(&(*__args)->elements,&local_c8);
      goto LAB_0014761a;
    case Name:
      MVar13 = Terminal;
      lVar9 = local_58.value._M_len - 4;
      switch(lVar9) {
      case 0:
switchD_001474c1_caseD_0:
        iVar6 = bcmp(__s1,"Null",__n);
        if (iVar6 == 0) {
          MVar13 = Null;
        }
        else {
          MVar13 = Terminal;
          if (__n == 5) {
switchD_00147754_caseD_1:
            iVar6 = bcmp(__s1,"Tuple",__n);
            if (iVar6 == 0) {
              MVar13 = Tuple;
            }
            else {
              MVar13 = Terminal;
              if (__n == 6) goto switchD_001474c1_caseD_2;
              if (__n == 5) {
                iVar6 = bcmp(__s1,"Enum8",5);
                if (iVar6 == 0) {
                  MVar13 = Enum;
                }
                else {
                  MVar13 = Terminal;
                }
              }
            }
          }
          else {
            if (__n == 6) goto switchD_001474c1_caseD_2;
            if (__n == 8) goto switchD_001474c1_caseD_4;
          }
        }
        break;
      case 1:
        iVar6 = bcmp(local_58.value._M_str,"Array",local_58.value._M_len);
        if (iVar6 == 0) {
          MVar13 = Array;
        }
        else {
          MVar13 = Terminal;
          switch(lVar9) {
          case 0:
            goto switchD_001474c1_caseD_0;
          case 1:
            goto switchD_00147754_caseD_1;
          case 2:
            goto switchD_001474c1_caseD_2;
          case 3:
            break;
          case 4:
            goto switchD_001474c1_caseD_4;
          default:
            MVar13 = Terminal;
          }
        }
        break;
      case 2:
switchD_001474c1_caseD_2:
        iVar6 = bcmp(__s1,"Enum16",__n);
        MVar13 = (uint)(iVar6 == 0) * 2 + Terminal;
        break;
      case 4:
switchD_001474c1_caseD_4:
        iVar6 = bcmp(__s1,"Nullable",__n);
        if (iVar6 == 0) {
          MVar13 = Nullable;
        }
        else {
          MVar13 = Terminal;
          if (__n == 6) goto switchD_001474c1_caseD_2;
          if (__n == 5) goto switchD_00147754_caseD_1;
        }
      }
      (*__args)->meta = MVar13;
      local_c8._0_8_ = (size_type **)((long)&local_c8 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,local_58.value._M_str,local_58.value._M_str + __n);
      std::__cxx11::string::operator=((string *)&(*__args)->name,(string *)&local_c8);
      if ((size_type **)local_c8._0_8_ != (size_type **)((long)&local_c8 + 0x10U)) {
        operator_delete((void *)local_c8._0_8_,local_c8.name._M_string_length + 1);
      }
      cVar11 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)kTypeCode_abi_cxx11_,&(*__args)->name);
      if (cVar11.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_true>
          ._M_cur == (__node_type *)0x0) {
        CVar7 = Void;
      }
      else {
        CVar7 = *(Code *)((long)cVar11.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_true>
                                ._M_cur + 0x28);
      }
      (*__args)->code = CVar7;
      this_00 = local_40;
      break;
    case Number:
      (*__args)->meta = Number;
      local_c8._0_8_ = (long)&local_c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,local_58.value._M_str,
                 local_58.value._M_str + local_58.value._M_len);
      uVar12 = local_c8._0_8_;
      piVar8 = __errno_location();
      iVar6 = *piVar8;
      *piVar8 = 0;
      lVar9 = strtol((char *)uVar12,(char **)&local_38,10);
      if (local_38 == (size_type **)uVar12) {
        std::__throw_invalid_argument("stol");
LAB_001478c5:
        uVar12 = std::__throw_out_of_range("stol");
        _Unwind_Resume(uVar12);
      }
      if (*piVar8 == 0) {
        *piVar8 = iVar6;
      }
      else if (*piVar8 == 0x22) goto LAB_001478c5;
      (*__args)->value = lVar9;
      this_00 = local_40;
      if ((size_type **)local_c8._0_8_ != (size_type **)((long)&local_c8 + 0x10U)) {
        operator_delete((void *)local_c8._0_8_,local_c8.name._M_string_length + 1);
        this_00 = local_40;
      }
      break;
    case String:
      (*__args)->meta = String;
      local_c8._0_8_ = (size_type **)((long)&local_c8 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,local_58.value._M_str,
                 local_58.value._M_str + local_58.value._M_len);
      std::__cxx11::string::operator=((string *)&(*__args)->value_string,(string *)&local_c8);
      if ((size_type **)local_c8._0_8_ != (size_type **)((long)&local_c8 + 0x10U)) {
        operator_delete((void *)local_c8._0_8_,local_c8.name._M_string_length + 1);
      }
      break;
    case LPar:
      local_c8._0_8_ = (size_type **)0x0;
      local_c8.name.field_2._8_8_ = 0;
      local_c8.value_string.field_2._8_8_ = 0;
      local_c8.name._M_string_length = 0;
      local_c8.name.field_2._M_allocated_capacity = 0;
      local_c8.value = 0;
      local_c8.value_string._M_string_length = 0;
      local_c8.value_string.field_2._M_allocated_capacity = 0;
      local_c8.elements.
      super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8.elements.
      super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.elements.
      super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.name._M_dataplus._M_p = (pointer)paVar4;
      local_c8.value_string._M_dataplus._M_p = (pointer)paVar5;
      std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
      emplace_back<clickhouse::TypeAst>(&(*__args)->elements,&local_c8);
LAB_0014761a:
      std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::~vector
                (&local_c8.elements);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.value_string._M_dataplus._M_p != paVar5) {
        operator_delete(local_c8.value_string._M_dataplus._M_p,
                        local_c8.value_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.name._M_dataplus._M_p != paVar4) {
        operator_delete(local_c8.name._M_dataplus._M_p,
                        local_c8.name.field_2._M_allocated_capacity + 1);
      }
      ppTVar10 = (this->open_elements_).c.
                 super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppTVar10 ==
          (this->open_elements_).c.
          super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>>::
        _M_push_back_aux<clickhouse::TypeAst*const&>(this_00,__args);
      }
      else {
        *ppTVar10 = this->type_;
        piVar1 = &(this->open_elements_).c.
                  super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      *__args = ((*__args)->elements).
                super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
      break;
    case RPar:
      ppTVar10 = (this->open_elements_).c.
                 super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppTVar10 ==
          (this->open_elements_).c.
          super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppTVar10 = (this->open_elements_).c.
                   super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      *__args = ppTVar10[-1];
      std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::pop_back
                ((deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_> *)this_00);
      break;
    case EOS:
      pppTVar2 = (this->open_elements_).c.
                 super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      local_cc = (uint)(((long)(this->open_elements_).c.
                               super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->open_elements_).c.
                               super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                        ((long)(this->open_elements_).c.
                               super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->open_elements_).c.
                               super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                        ((((ulong)((long)pppTVar2 -
                                  (long)(this->open_elements_).c.
                                        super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                        + (ulong)(pppTVar2 == (_Map_pointer)0x0)) * 0x40 == 1);
LAB_001476d9:
      bVar3 = false;
      goto LAB_00147899;
    }
    bVar3 = true;
LAB_00147899:
    if (!bVar3) {
      return (bool)((byte)local_cc & 1);
    }
  } while( true );
}

Assistant:

bool TypeParser::Parse(TypeAst* type) {
    type_ = type;
    open_elements_.push(type_);

    do {
        const Token& token = NextToken();

        switch (token.type) {
            case Token::Name:
                type_->meta = GetTypeMeta(token.value);
                type_->name = std::string(token.value);
                type_->code = GetTypeCode(type_->name);
                break;
            case Token::Number:
                type_->meta = TypeAst::Number;
                type_->value = std::stol(std::string(token.value));
                break;
            case Token::String:
                type_->meta = TypeAst::String;
                type_->value_string = std::string(token.value);
                break;
            case Token::LPar:
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::RPar:
                type_ = open_elements_.top();
                open_elements_.pop();
                break;
            case Token::Assign:
            case Token::Comma:
                type_ = open_elements_.top();
                open_elements_.pop();
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::EOS:
                // Ubalanced braces, brackets, etc is an error.
                if (open_elements_.size() != 1) {
                    return false;
                }
                return true;
            case Token::Invalid:
                return false;
        }
    } while (true);
}